

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

char * __thiscall Pathie::Path::dirname(Path *this,char *__path)

{
  bool bVar1;
  long lVar2;
  Path *this_00;
  allocator local_b9;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          __path,".");
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_78,".",&local_b9);
    Path(this,&local_78);
    std::__cxx11::string::_M_dispose();
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __path,"..");
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_98,".",&local_b9);
      Path(this,&local_98);
      std::__cxx11::string::_M_dispose();
    }
    else {
      if ((*(long *)(__path + 8) == 1) && (**(char **)__path == '/')) {
        std::__cxx11::string::string((string *)&local_38,(string *)__path);
        Path(this,&local_38);
      }
      else {
        this_00 = (Path *)0x10f18c;
        lVar2 = std::__cxx11::string::rfind(__path,0x10f18c);
        if (lVar2 == -1) {
          std::__cxx11::string::string((string *)&local_b8,".",&local_b9);
          Path(this,&local_b8);
          std::__cxx11::string::_M_dispose();
          return (char *)this;
        }
        if (lVar2 == 0) {
          root(this,this_00);
          return (char *)this;
        }
        std::__cxx11::string::substr((ulong)&local_58,(ulong)__path);
        Path(this,&local_58);
      }
      std::__cxx11::string::_M_dispose();
    }
  }
  return (char *)this;
}

Assistant:

Path Path::dirname() const
{
  if (m_path == ".")
    return Path(".");
  else if (m_path == "..")
    return Path(".");
  else if (is_root())
    return Path(m_path);

  size_t pos = 0;
  if ((pos = m_path.rfind("/")) != string::npos) { // Single = intended
    if (pos == 0) { // /usr
      return root();
    }
#ifdef _WIN32
    else if (pos == 1 && m_path[1] == ':') { // X:/foo
      return root();
    }
#endif
    else { // regular/path or /regular/path
      return Path(m_path.substr(0, pos));
    }
  }